

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::computeFrhsXtra(SPxSolverBase<double> *this)

{
  bool bVar1;
  int iVar2;
  Status *pSVar3;
  double *pdVar4;
  ostream *poVar5;
  SPxInternalCodeException *this_00;
  SVectorBase<double> *vec;
  VectorBase<double> *in_RDI;
  double x;
  Status stat;
  int i;
  string *in_stack_ffffffffffffff78;
  SPxSolverBase<double> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  int iVar6;
  allocator local_39;
  string local_38 [32];
  double local_18;
  Status local_10;
  int local_c;
  
  local_c = 0;
  do {
    iVar6 = local_c;
    iVar2 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x255366);
    if (iVar2 <= iVar6) {
      return;
    }
    SPxBasisBase<double>::desc((SPxBasisBase<double> *)(in_RDI + 0x13));
    pSVar3 = SPxBasisBase<double>::Desc::colStatus
                       ((Desc *)in_stack_ffffffffffffff80,
                        (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    local_10 = *pSVar3;
    bVar1 = isBasic(in_stack_ffffffffffffff80,(Status)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    if (!bVar1) {
      vec = (SVectorBase<double> *)(ulong)(uint)(local_10 + D_ON_BOTH);
      iVar2 = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      switch(vec) {
      case (SVectorBase<double> *)0x0:
      case (SVectorBase<double> *)0x4:
        pdVar4 = SPxLPBase<double>::upper(&in_stack_ffffffffffffff80->super_SPxLPBase<double>,iVar2)
        ;
        local_18 = *pdVar4;
        break;
      default:
        poVar5 = std::operator<<((ostream *)&std::cerr,"ESVECS02 ERROR: ");
        poVar5 = std::operator<<(poVar5,"inconsistent basis must not happen!");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_38,"XSVECS02 This should never happen.",&local_39);
        SPxInternalCodeException::SPxInternalCodeException(this_00,in_stack_ffffffffffffff78);
        __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,
                    SPxInternalCodeException::~SPxInternalCodeException);
      case (SVectorBase<double> *)0x2:
        pdVar4 = SPxLPBase<double>::lower(&in_stack_ffffffffffffff80->super_SPxLPBase<double>,iVar2)
        ;
        local_18 = *pdVar4;
        break;
      case (SVectorBase<double> *)0x5:
        goto LAB_00255560;
      }
      if ((local_18 != 0.0) || (NAN(local_18))) {
        in_stack_ffffffffffffff78 =
             (string *)
             in_RDI[0x46].val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        vector(in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        VectorBase<double>::multAdd<double,double>
                  (in_RDI,(double *)CONCAT44(iVar6,in_stack_ffffffffffffff98),vec);
      }
    }
LAB_00255560:
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void SPxSolverBase<R>::computeFrhsXtra()
{

   assert(rep()  == COLUMN);
   assert(type() == LEAVE);

   for(int i = 0; i < this->nCols(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = this->desc().colStatus(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         // columnwise cases:
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));

         //lint -fallthrough
         case SPxBasisBase<R>::Desc::P_ON_UPPER :
            x = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            x = SPxLPBase<R>::lower(i);
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS02 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS02 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}